

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O2

void get_vault_monsters(chunk *c,char *racial_symbol,char *vault_type,char *data,wchar_t y1,
                       wchar_t y2,wchar_t x1,wchar_t x2)

{
  char *pcVar1;
  monster_race *pmVar2;
  loc grid;
  wchar_t x;
  long lVar3;
  wchar_t generated_level;
  wchar_t wVar4;
  
  for (lVar3 = 0; racial_symbol[lVar3] != '\0'; lVar3 = lVar3 + 1) {
    allow_unique = true;
    pcVar1 = format("%c");
    my_strcpy(base_d_char,pcVar1,0xf);
    wVar4 = c->depth;
    select_current_level = wVar4;
    pcVar1 = strstr(vault_type,"Lesser vault");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(vault_type,"Medium vault");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(vault_type,"Greater vault");
        generated_level = wVar4 + L'\x06';
        if (pcVar1 == (char *)0x0) {
          generated_level = wVar4;
        }
      }
      else {
        generated_level = wVar4 + L'\x04';
      }
    }
    else {
      generated_level = wVar4 + L'\x02';
    }
    get_mon_num_prep(mon_select);
    pmVar2 = get_mon_num(generated_level,c->depth);
    pcVar1 = data;
    wVar4 = y1;
    if (pmVar2 != (monster_race *)0x0) {
      for (; x = x1, wVar4 <= y2; wVar4 = wVar4 + L'\x01') {
        for (; x <= x2; x = x + L'\x01') {
          if (*pcVar1 == racial_symbol[lVar3]) {
            grid = (loc)loc(x,wVar4);
            pick_and_place_monster(c,grid,generated_level,false,false,'\v');
          }
          pcVar1 = pcVar1 + 1;
        }
      }
    }
  }
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  return;
}

Assistant:

void get_vault_monsters(struct chunk *c, char racial_symbol[], char *vault_type,
						const char *data, int y1, int y2, int x1, int x2)
{
	int i, y, x, depth;
	const char *t;

	for (i = 0; racial_symbol[i] != '\0'; i++) {
		/* Require correct race, allow uniques. */
		allow_unique = true;
		my_strcpy(base_d_char, format("%c", racial_symbol[i]),
			sizeof(base_d_char));
		select_current_level = c->depth;

		/* Determine level of monster */
		if (strstr(vault_type, "Lesser vault"))
			depth = c->depth + 2;
		else if (strstr(vault_type, "Medium vault"))
			depth = c->depth + 4;
		else if (strstr(vault_type, "Greater vault"))
			depth = c->depth + 6;
		else
			depth = c->depth;

		/* Prepare allocation table */
		get_mon_num_prep(mon_select);

		/* Build the monster probability table. */
		if (!get_mon_num(depth, c->depth))
			continue;


		/* Place the monsters */
		for (t = data, y = y1; y <= y2; y++) {
			for (x = x1; x <= x2; x++, t++) {
				if (*t == racial_symbol[i]) {
					/* Place a monster */
					pick_and_place_monster(c, loc(x, y), depth, false,
																false, ORIGIN_DROP_SPECIAL);
				}
			}
		}
	}

	/* Clear any current monster restrictions. */
	get_mon_num_prep(NULL);
}